

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O0

QString * __thiscall
Win32MakefileGenerator::escapeFilePath(Win32MakefileGenerator *this,QString *path)

{
  bool bVar1;
  QString *this_00;
  char *pcVar2;
  QStringBuilder<const_char_(&)[2],_QString_&> *in_RDI;
  long in_FS_OFFSET;
  QString *ret;
  QStringBuilder<QStringBuilder<const_char_(&)[2],_QString_&>,_const_char_(&)[2]>
  *in_stack_ffffffffffffff48;
  QStringBuilder<const_char_(&)[2],_QString_&> *pQVar3;
  QChar c;
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->a)->d = (Data *)0xaaaaaaaaaaaaaaaa;
  in_RDI->b = (QString *)0xaaaaaaaaaaaaaaaa;
  in_RDI[1].a = (char (*) [2])0xaaaaaaaaaaaaaaaa;
  pQVar3 = in_RDI;
  QString::QString((QString *)in_RDI,(QString *)in_stack_ffffffffffffff48);
  c.ucs = (char16_t)((ulong)pQVar3 >> 0x30);
  bVar1 = QString::isEmpty((QString *)0x2bb411);
  if (bVar1) goto LAB_002bb549;
  QChar::QChar<char,_true>((QChar *)&stack0xfffffffffffffff6,' ');
  bVar1 = QString::contains((QString *)in_RDI,c,
                            (CaseSensitivity)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  if (bVar1) {
LAB_002bb475:
    ::operator+((char (*) [2])in_RDI,(QString *)in_stack_ffffffffffffff48);
    ::operator+(in_RDI,(char (*) [2])in_stack_ffffffffffffff48);
    ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff48);
    QString::operator=((QString *)in_RDI,(QString *)in_stack_ffffffffffffff48);
    QString::~QString((QString *)0x2bb4d7);
  }
  else {
    QChar::QChar<char,_true>((QChar *)&stack0xfffffffffffffff4,'\t');
    bVar1 = QString::contains((QString *)in_RDI,c,
                              (CaseSensitivity)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    if (bVar1) goto LAB_002bb475;
  }
  if (Option::debug_level != 0) {
    QString::toLatin1((QString *)in_stack_ffffffffffffff48);
    this_00 = (QString *)QByteArray::constData((QByteArray *)0x2bb4fc);
    QString::toLatin1(this_00);
    pcVar2 = QByteArray::constData((QByteArray *)0x2bb519);
    debug_msg_internal(2,"EscapeFilePath: %s -> %s",this_00,pcVar2);
    QByteArray::~QByteArray((QByteArray *)0x2bb53d);
    QByteArray::~QByteArray((QByteArray *)0x2bb547);
  }
LAB_002bb549:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString Win32MakefileGenerator::escapeFilePath(const QString &path) const
{
    QString ret = path;
    if(!ret.isEmpty()) {
        if (ret.contains(' ') || ret.contains('\t'))
            ret = "\"" + ret + "\"";
        debug_msg(2, "EscapeFilePath: %s -> %s", path.toLatin1().constData(), ret.toLatin1().constData());
    }
    return ret;
}